

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void ClipperLib::CleanPolygon(Path *in_poly,Path *out_poly,double distance)

{
  undefined8 *puVar1;
  int *piVar2;
  int *piVar3;
  undefined4 *puVar4;
  undefined1 auVar5 [16];
  double distSqrd;
  cInt cVar6;
  undefined8 uVar7;
  bool bVar8;
  int *piVar9;
  ulong uVar10;
  int *piVar11;
  ulong uVar12;
  pointer pIVar13;
  size_type sVar14;
  long lVar15;
  ulong __new_size;
  double dVar16;
  double dVar17;
  
  pIVar13 = (in_poly->
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>)._M_impl
            .super__Vector_impl_data._M_start;
  lVar15 = (long)(in_poly->
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                 _M_impl.super__Vector_impl_data._M_finish - (long)pIVar13;
  if (lVar15 == 0) {
    pIVar13 = (out_poly->
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((out_poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
        _M_impl.super__Vector_impl_data._M_finish != pIVar13) {
      (out_poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
      _M_impl.super__Vector_impl_data._M_finish = pIVar13;
    }
    return;
  }
  __new_size = lVar15 >> 4;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = __new_size;
  uVar10 = 0xffffffffffffffff;
  if (SUB168(auVar5 * ZEXT816(0x28),8) == 0) {
    uVar10 = SUB168(auVar5 * ZEXT816(0x28),0);
  }
  piVar9 = (int *)operator_new__(uVar10);
  lVar15 = 0;
  do {
    puVar1 = (undefined8 *)((long)piVar9 + lVar15 + 8);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar15 = lVar15 + 0x28;
  } while (__new_size * 0x28 - lVar15 != 0);
  piVar11 = piVar9;
  for (uVar10 = 1; uVar10 - __new_size != 1; uVar10 = uVar10 + 1) {
    cVar6 = pIVar13->Y;
    uVar12 = uVar10;
    if (uVar10 == __new_size) {
      uVar12 = 0;
    }
    *(cInt *)(piVar11 + 2) = pIVar13->X;
    *(cInt *)(piVar11 + 4) = cVar6;
    *(int **)(piVar11 + 6) = piVar9 + uVar12 * 10;
    *(int **)(piVar9 + uVar12 * 10 + 8) = piVar11;
    *piVar11 = 0;
    pIVar13 = pIVar13 + 1;
    piVar11 = piVar11 + 10;
  }
  distSqrd = distance * distance;
  piVar11 = piVar9;
  while (*piVar11 == 0) {
    piVar2 = *(int **)(piVar11 + 6);
    piVar3 = *(int **)(piVar11 + 8);
    if (piVar2 == piVar3) break;
    dVar16 = (double)*(long *)(piVar11 + 2) - (double)*(long *)(piVar3 + 2);
    dVar17 = (double)*(long *)(piVar11 + 4) - (double)*(long *)(piVar3 + 4);
    if (dVar16 * dVar16 + dVar17 * dVar17 <= distSqrd) {
      *(int **)(piVar3 + 6) = piVar2;
      *(int **)(piVar2 + 8) = piVar3;
      *piVar3 = 0;
      __new_size = __new_size - 1;
      piVar11 = piVar3;
    }
    else {
      dVar17 = (double)*(long *)(piVar3 + 2) - (double)*(long *)(piVar2 + 2);
      dVar16 = (double)*(long *)(piVar3 + 4) - (double)*(long *)(piVar2 + 4);
      if (dVar17 * dVar17 + dVar16 * dVar16 <= distSqrd) {
        lVar15 = *(long *)(piVar2 + 6);
        puVar4 = *(undefined4 **)(piVar2 + 8);
        *(long *)(puVar4 + 6) = lVar15;
        *(undefined4 **)(lVar15 + 0x20) = puVar4;
        *puVar4 = 0;
        lVar15 = *(long *)(piVar11 + 6);
        piVar11 = *(int **)(piVar11 + 8);
        *(long *)(piVar11 + 6) = lVar15;
        *(int **)(lVar15 + 0x20) = piVar11;
        *piVar11 = 0;
        __new_size = __new_size - 2;
      }
      else {
        bVar8 = SlopesNearCollinear((IntPoint *)(piVar3 + 2),(IntPoint *)(piVar11 + 2),
                                    (IntPoint *)(piVar2 + 2),distSqrd);
        if (bVar8) {
          *(int **)(piVar3 + 6) = piVar2;
          *(int **)(piVar2 + 8) = piVar3;
          *piVar3 = 0;
          __new_size = __new_size - 1;
          piVar11 = piVar3;
        }
        else {
          *piVar11 = 1;
          piVar11 = piVar2;
        }
      }
    }
  }
  sVar14 = 0;
  if (__new_size < 3) {
    __new_size = sVar14;
  }
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::resize
            (out_poly,__new_size);
  while (bVar8 = __new_size != 0, __new_size = __new_size - 1, bVar8) {
    uVar7 = *(undefined8 *)(piVar11 + 4);
    puVar1 = (undefined8 *)
             ((long)&((out_poly->
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      )._M_impl.super__Vector_impl_data._M_start)->X + sVar14);
    *puVar1 = *(undefined8 *)(piVar11 + 2);
    puVar1[1] = uVar7;
    piVar11 = *(int **)(piVar11 + 6);
    sVar14 = sVar14 + 0x10;
  }
  operator_delete__(piVar9);
  return;
}

Assistant:

void CleanPolygon(const Path& in_poly, Path& out_poly, double distance)
{
  //distance = proximity in units/pixels below which vertices
  //will be stripped. Default ~= sqrt(2).
  
  size_t size = in_poly.size();
  
  if (size == 0) 
  {
    out_poly.clear();
    return;
  }

  OutPt* outPts = new OutPt[size];
  for (size_t i = 0; i < size; ++i)
  {
    outPts[i].Pt = in_poly[i];
    outPts[i].Next = &outPts[(i + 1) % size];
    outPts[i].Next->Prev = &outPts[i];
    outPts[i].Idx = 0;
  }

  double distSqrd = distance * distance;
  OutPt* op = &outPts[0];
  while (op->Idx == 0 && op->Next != op->Prev) 
  {
    if (PointsAreClose(op->Pt, op->Prev->Pt, distSqrd))
    {
      op = ExcludeOp(op);
      size--;
    } 
    else if (PointsAreClose(op->Prev->Pt, op->Next->Pt, distSqrd))
    {
      ExcludeOp(op->Next);
      op = ExcludeOp(op);
      size -= 2;
    }
    else if (SlopesNearCollinear(op->Prev->Pt, op->Pt, op->Next->Pt, distSqrd))
    {
      op = ExcludeOp(op);
      size--;
    }
    else
    {
      op->Idx = 1;
      op = op->Next;
    }
  }

  if (size < 3) size = 0;
  out_poly.resize(size);
  for (size_t i = 0; i < size; ++i)
  {
    out_poly[i] = op->Pt;
    op = op->Next;
  }
  delete [] outPts;
}